

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
llvm::SmallVectorImpl<llvm::StringRef>::emplace_back<char_const*&>
          (SmallVectorImpl<llvm::StringRef> *this,char **Args)

{
  uint uVar1;
  void *pvVar2;
  char *__s;
  size_t sVar3;
  
  if ((this->super_SmallVectorTemplateBase<llvm::StringRef,_true>).
      super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Capacity <=
      (this->super_SmallVectorTemplateBase<llvm::StringRef,_true>).
      super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size) {
    emplace_back<char_const*&>(this);
  }
  pvVar2 = (this->super_SmallVectorTemplateBase<llvm::StringRef,_true>).
           super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX;
  uVar1 = (this->super_SmallVectorTemplateBase<llvm::StringRef,_true>).
          super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size;
  __s = *Args;
  *(char **)((long)pvVar2 + (ulong)uVar1 * 0x10) = __s;
  if (__s == (char *)0x0) {
    sVar3 = 0;
  }
  else {
    sVar3 = strlen(__s);
  }
  *(size_t *)((long)pvVar2 + (ulong)uVar1 * 0x10 + 8) = sVar3;
  if (uVar1 < (this->super_SmallVectorTemplateBase<llvm::StringRef,_true>).
              super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Capacity)
  {
    (this->super_SmallVectorTemplateBase<llvm::StringRef,_true>).
    super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size = uVar1 + 1;
    return;
  }
  __assert_fail("Size <= capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                ,0x44,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

void emplace_back(ArgTypes &&... Args) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    ::new ((void *)this->end()) T(std::forward<ArgTypes>(Args)...);
    this->set_size(this->size() + 1);
  }